

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O0

void calc<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (options *opt)

{
  bool bVar1;
  _Setprecision _Var2;
  invalid_argument *piVar3;
  ostream *poVar4;
  void *this;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  f;
  autodiff_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U>_>_>,_2UL>
  beta;
  real_t t;
  real_t dT;
  real_t Tmax;
  real_t Tmin;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_stack_000012b0;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_000012b8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_000012c0;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_000012c8;
  ostream *in_stack_fffffffffffff1e8;
  ostream *in_stack_fffffffffffff1f0;
  string *in_stack_fffffffffffff1f8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff250;
  undefined4 in_stack_fffffffffffff258;
  int in_stack_fffffffffffff25c;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_stack_fffffffffffff340;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_stack_fffffffffffff348;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_stack_fffffffffffff4d0;
  fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
  *in_stack_fffffffffffff4d8;
  
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffff1f8);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffff1f8);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffff1f8);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffff1f8);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffff1f8);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffff1f8);
  bVar1 = operator>((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_stack_fffffffffffff1f0,
                    (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)in_stack_fffffffffffff1e8);
  if (bVar1) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Tmax should be larger than Tmin");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = operator<=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff1f0,(int *)in_stack_fffffffffffff1e8);
  if (!bVar1) {
    poVar4 = (ostream *)std::ostream::operator<<(&std::cout,std::scientific);
    _Var2 = std::setprecision(100);
    poVar4 = std::operator<<(poVar4,_Var2);
    poVar4 = std::operator<<(poVar4,"# lattice: triangular\n");
    poVar4 = std::operator<<(poVar4,"# precision: ");
    this = (void *)std::ostream::operator<<(poVar4,100);
    poVar4 = (ostream *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar4,"# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n");
    mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
    ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff1f0,
                 (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff1e8);
    while( true ) {
      operator*((double)CONCAT44(in_stack_fffffffffffff25c,in_stack_fffffffffffff258),
                in_stack_fffffffffffff250);
      operator+((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                 *)CONCAT44(in_stack_fffffffffffff25c,in_stack_fffffffffffff258),
                in_stack_fffffffffffff250);
      bVar1 = operator<((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                         *)in_stack_fffffffffffff1f0,
                        (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                         *)in_stack_fffffffffffff1e8);
      if (!bVar1) break;
      operator/(in_stack_fffffffffffff25c,in_stack_fffffffffffff250);
      boost::math::differentiation::autodiff_v1::
      make_fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff1e8);
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff1f0,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff1e8);
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff1f0,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff1e8);
      mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
      ::mp_wrapper((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff1f0,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_stack_fffffffffffff1e8);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
      ::fvar((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1f0,
             (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1e8);
      ising::free_energy::triangular::
      infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
                (in_stack_000012c8,in_stack_000012c0,in_stack_000012b8,in_stack_000012b0);
      std::operator<<((ostream *)&std::cout,"inf inf ");
      poVar4 = operator<<(in_stack_fffffffffffff1f0,
                          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff1e8);
      std::operator<<(poVar4,' ');
      poVar4 = operator<<(in_stack_fffffffffffff1f0,
                          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff1e8);
      std::operator<<(poVar4,' ');
      poVar4 = operator<<(in_stack_fffffffffffff1f0,
                          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff1e8);
      std::operator<<(poVar4,' ');
      poVar4 = operator<<(in_stack_fffffffffffff1f0,
                          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff1e8);
      in_stack_fffffffffffff1e8 = std::operator<<(poVar4,' ');
      operator/(in_stack_fffffffffffff25c,in_stack_fffffffffffff250);
      poVar4 = operator<<(in_stack_fffffffffffff1f0,
                          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff1e8);
      in_stack_fffffffffffff1f0 = std::operator<<(poVar4,' ');
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
      ::fvar((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1f0,
             (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1e8);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
      ::fvar((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1f0,
             (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1e8);
      ising::free_energy::
      free_energy<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
                ((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                  *)in_stack_fffffffffffff1f8,
                 (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
                  *)in_stack_fffffffffffff1f0);
      poVar4 = operator<<(in_stack_fffffffffffff1f0,
                          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff1e8);
      in_stack_fffffffffffff1f8 = (string *)std::operator<<(poVar4,' ');
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
      ::fvar((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1f0,
             (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1e8);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
      ::fvar((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1f0,
             (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1e8);
      ising::free_energy::
      energy<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
                (in_stack_fffffffffffff348,in_stack_fffffffffffff340);
      poVar4 = operator<<(in_stack_fffffffffffff1f0,
                          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff1e8);
      std::operator<<(poVar4,' ');
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
      ::fvar((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1f0,
             (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1e8);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
      ::fvar((fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1f0,
             (fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_2UL>
              *)in_stack_fffffffffffff1e8);
      ising::free_energy::
      specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,2ul>>
                (in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0);
      poVar4 = operator<<(in_stack_fffffffffffff1f0,
                          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                           *)in_stack_fffffffffffff1e8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      operator+=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff1f0,
                 (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff1e8);
    }
    return;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"dT should be positive");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options &opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Ja = convert<real_t>(opt.Ja);
  real_t Jb = convert<real_t>(opt.Jb);
  real_t Jc = convert<real_t>(opt.Jc);
  real_t Tmin = convert<real_t>(opt.Tmin);
  real_t Tmax = convert<real_t>(opt.Tmax);
  real_t dT = convert<real_t>(opt.dT);
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << "inf inf " << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' '
              << (1 / t) << ' ' << free_energy(f, beta) << ' '
              << energy(f, beta) << ' ' << specific_heat(f, beta) << std::endl;
  }
}